

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::ArgumentParser::ArgumentParser(ArgumentParser *this,string *description_,string *epilog_)

{
  pointer pcVar1;
  function<bool_(const_args::Group_&)> local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  local_70.super__Function_base._M_functor._8_8_ = 0;
  local_70.super__Function_base._M_functor._M_unused._M_object = Group::Validators::AllChildGroups;
  local_70._M_invoker =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_70.super__Function_base._M_manager =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_manager
  ;
  Group::Group(&this->super_Group,&local_50,&local_70);
  if (local_70.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_70.super__Function_base._M_manager)
              ((_Any_data *)&local_70,(_Any_data *)&local_70,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Group).super_Base._vptr_Base = (_func_int **)&PTR__ArgumentParser_00131300;
  (this->prog)._M_dataplus._M_p = (pointer)&(this->prog).field_2;
  (this->prog)._M_string_length = 0;
  (this->prog).field_2._M_local_buf[0] = '\0';
  (this->proglinePostfix)._M_dataplus._M_p = (pointer)&(this->proglinePostfix).field_2;
  (this->proglinePostfix)._M_string_length = 0;
  (this->proglinePostfix).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (description_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + description_->_M_string_length);
  (this->epilog)._M_dataplus._M_p = (pointer)&(this->epilog).field_2;
  pcVar1 = (epilog_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->epilog,pcVar1,pcVar1 + epilog_->_M_string_length);
  (this->longprefix)._M_dataplus._M_p = (pointer)&(this->longprefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->longprefix,"--","");
  (this->shortprefix)._M_dataplus._M_p = (pointer)&(this->shortprefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->shortprefix,"-","");
  (this->longseparator)._M_dataplus._M_p = (pointer)&(this->longseparator).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->longseparator,"=","");
  (this->terminator)._M_dataplus._M_p = (pointer)&(this->terminator).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->terminator,"--","");
  this->allowJoinedShortValue = true;
  this->allowJoinedLongValue = true;
  this->allowSeparateShortValue = true;
  this->allowSeparateLongValue = true;
  (this->helpParams).width = 0x50;
  (this->helpParams).progindent = 2;
  (this->helpParams).progtailindent = 4;
  (this->helpParams).descriptionindent = 4;
  (this->helpParams).flagindent = 6;
  (this->helpParams).helpindent = 0x28;
  (this->helpParams).eachgroupindent = 2;
  (this->helpParams).gutter = 1;
  (this->helpParams).showTerminator = true;
  (this->helpParams).showProglineOptions = true;
  (this->helpParams).showProglinePositionals = true;
  return;
}

Assistant:

ArgumentParser(const std::string &description_, const std::string &epilog_ = std::string()) :
                Group("", Group::Validators::AllChildGroups),
                description(description_),
                epilog(epilog_),
                longprefix("--"),
                shortprefix("-"),
                longseparator("="),
                terminator("--"),
                allowJoinedShortValue(true),
                allowJoinedLongValue(true),
                allowSeparateShortValue(true),
                allowSeparateLongValue(true) {}